

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_adaptive.cpp
# Opt level: O0

subscription_storage_factory_t *
so_5::adaptive_subscription_storage_factory
          (subscription_storage_factory_t *__return_storage_ptr__,size_t threshold,
          subscription_storage_factory_t *small_storage_factory,
          subscription_storage_factory_t *large_storage_factory)

{
  anon_class_72_3_5dbc931d local_70;
  function<std::unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>_(so_5::agent_t_*)>
  *local_28;
  subscription_storage_factory_t *large_storage_factory_local;
  subscription_storage_factory_t *small_storage_factory_local;
  size_t threshold_local;
  
  local_70.threshold = threshold;
  local_28 = large_storage_factory;
  large_storage_factory_local = small_storage_factory;
  small_storage_factory_local = (subscription_storage_factory_t *)threshold;
  threshold_local = (size_t)__return_storage_ptr__;
  std::
  function<std::unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>_(so_5::agent_t_*)>
  ::function(&local_70.small_storage_factory,small_storage_factory);
  std::
  function<std::unique_ptr<so_5::impl::subscription_storage_t,_std::default_delete<so_5::impl::subscription_storage_t>_>_(so_5::agent_t_*)>
  ::function(&local_70.large_storage_factory,local_28);
  std::
  function<std::unique_ptr<so_5::impl::subscription_storage_t,std::default_delete<so_5::impl::subscription_storage_t>>(so_5::agent_t*)>
  ::
  function<so_5::adaptive_subscription_storage_factory(unsigned_long,std::function<std::unique_ptr<so_5::impl::subscription_storage_t,std::default_delete<so_5::impl::subscription_storage_t>>(so_5::agent_t*)>const&,std::function<std::unique_ptr<so_5::impl::subscription_storage_t,std::default_delete<so_5::impl::subscription_storage_t>>(so_5::agent_t*)>const&)::__0,void>
            ((function<std::unique_ptr<so_5::impl::subscription_storage_t,std::default_delete<so_5::impl::subscription_storage_t>>(so_5::agent_t*)>
              *)__return_storage_ptr__,&local_70);
  adaptive_subscription_storage_factory(unsigned_long,std::function<std::unique_ptr<so_5::impl::subscription_storage_t,std::default_delete<so_5::impl::subscription_storage_t>>(so_5::agent_t*)>const&,std::function<std::unique_ptr<so_5::impl::subscription_storage_t,std::default_delete<so_5::impl::subscription_storage_t>>(so_5::agent_t*)>const&)
  ::$_0::~__0((__0 *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

SO_5_FUNC subscription_storage_factory_t
adaptive_subscription_storage_factory(
	std::size_t threshold,
	const subscription_storage_factory_t & small_storage_factory,
	const subscription_storage_factory_t & large_storage_factory )
	{
		return [=]( agent_t * owner ) {
			return impl::subscription_storage_unique_ptr_t(
					new impl::adaptive_subscr_storage::storage_t(
							owner,
							threshold,
							small_storage_factory( owner ),
							large_storage_factory( owner ) ) );
		};
	}